

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O1

bool __thiscall Ratio::containsOriginalEEdge(Ratio *this,Bipartition *edge)

{
  PhyloTreeEdge *pPVar1;
  bool bVar2;
  bool bVar3;
  PhyloTreeEdge *ratio_edge;
  PhyloTreeEdge *pPVar4;
  Bipartition *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  
  pPVar4 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (this->eEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    bVar2 = pPVar4 != pPVar1;
    if (!bVar2) {
LAB_0012cf4d:
      pPVar4 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pPVar1 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        bVar2 = pPVar4 != pPVar1;
        if (!bVar2) {
          return bVar2;
        }
        PhyloTreeEdge::getOriginalEdge(pPVar4);
        bVar3 = Bipartition::equals(local_48,edge);
        if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
        }
        if (bVar3) break;
        pPVar4 = pPVar4 + 1;
      }
      return bVar2;
    }
    PhyloTreeEdge::getOriginalEdge(pPVar4);
    bVar3 = Bipartition::equals(local_48,edge);
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    if (bVar3) {
      if (bVar2) {
        return true;
      }
      goto LAB_0012cf4d;
    }
    pPVar4 = pPVar4 + 1;
  } while( true );
}

Assistant:

bool Ratio::containsOriginalEEdge(const Bipartition &edge) {

    for (PhyloTreeEdge &ratio_edge : eEdges) {
        if (ratio_edge.getOriginalEdge()->equals(edge)) {
            return true;
        }
    }

    for (PhyloTreeEdge &ratio_edge : fEdges) {
        if (ratio_edge.getOriginalEdge()->equals(edge)) {
            return true;
        }
    }
    return false;
}